

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xsClient.cpp
# Opt level: O0

void xs::sendMessage(Socket *socket,Message *message)

{
  size_t sVar1;
  size_type sVar2;
  reference pvVar3;
  ssize_t sVar4;
  SocketError *this;
  undefined8 in_R8;
  long lStack_58;
  deSocketResult result;
  size_t numSent;
  size_t numLeft;
  size_t pos;
  undefined1 local_30 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> buf;
  Message *message_local;
  Socket *socket_local;
  
  buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)message;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  (**(code **)(*(long *)buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_end_of_storage + 0x10))
            (buf.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage,
             (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
  numLeft = 0;
  while( true ) {
    sVar1 = numLeft;
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    if (sVar2 <= sVar1) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
      return;
    }
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30);
    numSent = sVar2 - numLeft;
    lStack_58 = 0;
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_30,numLeft);
    sVar4 = de::Socket::send(socket,(int)pvVar3,(void *)numSent,(size_t)&stack0xffffffffffffffa8,
                             (int)in_R8);
    if ((deSocketResult)sVar4 != DE_SOCKETRESULT_SUCCESS) break;
    numLeft = lStack_58 + numLeft;
  }
  this = (SocketError *)__cxa_allocate_exception(0x18);
  SocketError::SocketError
            (this,(deSocketResult)sVar4,"send() failed",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/execserver/tools/xsClient.cpp"
             ,0x4e);
  __cxa_throw(this,&SocketError::typeinfo,SocketError::~SocketError);
}

Assistant:

void sendMessage (de::Socket& socket, const Message& message)
{
	// Format message.
	vector<deUint8> buf;
	message.write(buf);

	// Write to socket.
	size_t pos = 0;
	while (pos < buf.size())
	{
		size_t			numLeft		= buf.size() - pos;
		size_t			numSent		= 0;
		deSocketResult	result		= socket.send(&buf[pos], numLeft, &numSent);

		if (result != DE_SOCKETRESULT_SUCCESS)
			throw SocketError(result, "send() failed", __FILE__, __LINE__);

		pos += numSent;
	}
}